

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O1

Program __thiscall Lowering::run(Lowering *this,Program *program)

{
  pointer ppTVar1;
  TypeTable *pTVar2;
  Function *this_00;
  Type *return_type;
  mapped_type *ppFVar3;
  Function *extraout_RDX;
  Function *pFVar4;
  pointer ppTVar5;
  Program PVar6;
  vector<const_Type_*,_std::allocator<const_Type_*>_> argument_types;
  Function *function;
  FunctionTable function_table;
  TypeTable type_table;
  vector<const_Type_*,_std::allocator<const_Type_*>_> local_c8;
  Function *local_b0;
  Function *local_a8;
  Program *local_a0;
  Type *local_98;
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  local_90;
  _Rb_tree<const_Type_*,_std::pair<const_Type_*const,_const_Type_*>,_std::_Select1st<std::pair<const_Type_*const,_const_Type_*>_>,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
  local_60;
  
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->type_table = (TypeTable *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar4 = program->first;
  local_a0 = program;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar4 != (Function *)0x0) {
    local_b0 = (Function *)this;
    do {
      local_c8.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppTVar1 = (pFVar4->argument_types).
                super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_a8 = pFVar4;
      for (ppTVar5 = (pFVar4->argument_types).
                     super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                     super__Vector_impl_data._M_start; this = (Lowering *)local_b0,
          ppTVar5 != ppTVar1; ppTVar5 = ppTVar5 + 1) {
        local_98 = transform_type((TypeTable *)&local_60,*ppTVar5);
        std::vector<Type_const*,std::allocator<Type_const*>>::emplace_back<Type_const*>
                  ((vector<Type_const*,std::allocator<Type_const*>> *)&local_c8,&local_98);
      }
      this_00 = (Function *)operator_new(0x60);
      return_type = transform_type((TypeTable *)&local_60,local_a8->return_type);
      Function::Function(this_00,&local_c8,return_type);
      if ((_func_int **)(((Function *)this)->path)._M_dataplus._M_p == (_func_int **)0x0) {
        (((Function *)this)->path)._M_dataplus._M_p = (pointer)this_00;
      }
      pTVar2 = (TypeTable *)(((Function *)this)->path)._M_string_length;
      if (pTVar2 != (TypeTable *)0x0) {
        pTVar2[1]._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
      }
      (((Function *)this)->path)._M_string_length = (size_type)this_00;
      ppFVar3 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_90,&local_a8);
      *ppFVar3 = this_00;
      if ((Function *)
          local_c8.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
          super__Vector_impl_data._M_start != (Function *)0x0) {
        operator_delete(local_c8.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pFVar4 = pFVar4->next_function;
    } while (pFVar4 != (Function *)0x0);
  }
  pFVar4 = local_a0->first;
  if (pFVar4 != (Function *)0x0) {
    do {
      local_c8.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pFVar4;
      ppFVar3 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_90,(key_type *)&local_c8);
      evaluate((TypeTable *)&local_60,(FunctionTable *)&local_90,&(*ppFVar3)->block,
               (Block *)((long)local_c8.
                               super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0x20));
      pFVar4 = pFVar4->next_function;
    } while (pFVar4 != (Function *)0x0);
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<const_Type_*,_std::pair<const_Type_*const,_const_Type_*>,_std::_Select1st<std::pair<const_Type_*const,_const_Type_*>_>,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
  ::~_Rb_tree(&local_60);
  PVar6.last = extraout_RDX;
  PVar6.first = (Function *)this;
  return PVar6;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		TypeTable type_table;
		FunctionTable function_table;
		for (const Function* function: program) {
			std::vector<const Type*> argument_types;
			for (const Type* type: function->get_argument_types()) {
				argument_types.push_back(transform_type(type_table, type));
			}
			Function* new_function = new Function(argument_types, transform_type(type_table, function->get_return_type()));
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			evaluate(type_table, function_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}